

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

bool prometheus::(anonymous_namespace)::
     FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>
               (string *name,
               vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
               *families)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<const_std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>_>
  __it;
  string *local_40;
  unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
  *local_38;
  
  __it._M_current =
       (families->
       super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (families->
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_38 - (long)__it._M_current;
  local_40 = name;
  for (lVar2 = lVar4 >> 5; _Var3._M_current = __it._M_current, 0 < lVar2; lVar2 = lVar2 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                          *)&local_40,__it);
    if (bVar1) goto LAB_0014c1c5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                          *)&local_40,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0014c1c5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                          *)&local_40,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0014c1c5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                          *)&local_40,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0014c1c5;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current = local_38;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
                  ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                                *)&local_40,__it), _Var3._M_current = __it._M_current, bVar1))
      goto LAB_0014c1c5;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
            ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                          *)&local_40,_Var3);
    if (bVar1) goto LAB_0014c1c5;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::{lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)#1}>
          ::operator()((_Iter_pred<prometheus::(anonymous_namespace)::FamilyNameExists<std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>(std::__cxx11::string_const&,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>
                        *)&local_40,__it);
  _Var3._M_current = local_38;
  if (bVar1) {
    _Var3._M_current = __it._M_current;
  }
LAB_0014c1c5:
  return _Var3._M_current !=
         (families->
         super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool FamilyNameExists(const std::string& name, const T& families,
                      Args&&... args) {
  auto sameName = [&name](const typename T::value_type& entry) {
    return name == entry->GetName();
  };
  auto exists = std::find_if(std::begin(families), std::end(families),
                             sameName) != std::end(families);
  return exists || FamilyNameExists(name, args...);
}